

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpsend.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__nptr;
  int iVar1;
  int iVar2;
  int extraout_EAX;
  size_t sVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  __u32 force_tx_stmin;
  sockaddr_can addr;
  uchar buf [67000];
  undefined4 uStack_10614;
  ulong uStack_10610;
  sockaddr sStack_10608;
  ulong uStack_105f0;
  char acStack_105e8 [67000];
  
  uStack_10614 = 0;
  sStack_10608.sa_data[6] = -1;
  sStack_10608.sa_data[7] = -1;
  sStack_10608.sa_data[8] = -1;
  sStack_10608.sa_data[9] = -1;
  sStack_10608.sa_data[10] = -1;
  sStack_10608.sa_data[0xb] = -1;
  sStack_10608.sa_data[0xc] = -1;
  sStack_10608.sa_data[0xd] = -1;
  uVar8 = 1;
  uStack_10610 = 0;
  uStack_105f0 = 0;
LAB_00101669:
  iVar1 = getopt(argc,argv,"s:d:x:p:P:t:f:D:l:g:bSCL:?");
  __nptr = _optarg;
  if (iVar1 < 0x53) {
    if (0x43 < iVar1) {
      if (iVar1 == 0x44) {
        uStack_10610 = strtoul(_optarg,(char **)0x0,10);
        if (((int)uStack_10610 == 0) || (66999 < (int)uStack_10610)) goto LAB_00101c0e;
      }
      else if (iVar1 == 0x4c) {
        iVar1 = __isoc99_sscanf(_optarg,"%hhu:%hhu:%hhu",&main::llopts,0x1040d9,0x1040da);
        if (iVar1 != 3) goto LAB_00101c06;
      }
      else {
        if (iVar1 != 0x50) goto switchD_0010168a_caseD_63;
        cVar5 = *_optarg;
        if (cVar5 == 'a') {
          main::opts.flags = main::opts.flags | 0x30;
        }
        else if (cVar5 == 'c') {
          main::opts.flags = main::opts.flags | 0x20;
        }
        else {
          if (cVar5 != 'l') goto LAB_00101c26;
          main::opts.flags = main::opts.flags | 0x10;
        }
      }
      goto LAB_00101669;
    }
    if (iVar1 == 0x43) {
      main::opts.flags = main::opts.flags | 0x1000;
      goto LAB_00101669;
    }
    if (iVar1 != -1) {
      if (iVar1 == 0x3f) {
        main_cold_1();
      }
      goto switchD_0010168a_caseD_63;
    }
    if ((((argc - _optind != 1) || (sStack_10608.sa_data._10_4_ == 0xffffffff)) ||
        ((main::opts.flags & 0x1800) == 0x1800)) ||
       (((main::opts.flags & 0x1800) == 0 && (sStack_10608.sa_data._6_4_ == 0xffffffff))))
    goto LAB_00101c31;
    iVar1 = socket(0x1d,2,6);
    if (iVar1 < 0) goto LAB_00101c39;
    iVar2 = setsockopt(iVar1,0x6a,1,&main::opts,0xc);
    if (iVar2 < 0) goto LAB_00101c3e;
    if ((main::llopts.tx_dl != '\0') &&
       (iVar2 = setsockopt(iVar1,0x6a,5,&main::llopts,3), iVar2 < 0)) goto LAB_00101c4f;
    if ((main::opts.flags & 0x80) != 0) {
      setsockopt(iVar1,0x6a,3,&uStack_10614,4);
    }
    sStack_10608.sa_family = 0x1d;
    sStack_10608.sa_data._2_4_ = if_nametoindex(argv[_optind]);
    if (sStack_10608.sa_data._2_4_ == 0) goto LAB_00101c43;
    iVar2 = bind(iVar1,&sStack_10608,0x18);
    if (-1 < iVar2) {
      if ((int)uStack_10610 == 0) {
        uVar7 = 0;
        goto LAB_00101b23;
      }
      if ((int)uStack_10610 < 1) {
        uVar7 = 0;
      }
      else {
        cVar5 = '\x01';
        uVar6 = 0;
        uVar7 = 0;
        do {
          acStack_105e8[uVar7] = (char)((ulong)uVar6 / 0xff) + cVar5;
          uVar7 = uVar7 + 1;
          cVar5 = cVar5 + '\x01';
          uVar6 = uVar6 + 1;
        } while ((uStack_10610 & 0xffffffff) != uVar7);
      }
      goto LAB_00101b4f;
    }
  }
  else {
    switch(iVar1) {
    case 0x62:
      main::opts.flags = main::opts.flags | 0x400;
      goto LAB_00101669;
    case 99:
    case 0x65:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
switchD_0010168a_caseD_63:
      main_cold_14();
LAB_00101c06:
      main_cold_2();
LAB_00101c0e:
      main_cold_4();
LAB_00101c16:
      main_cold_7();
      break;
    case 100:
      uVar7 = strtoul(_optarg,(char **)0x0,0x10);
      sStack_10608.sa_data._6_4_ = (uint)uVar7;
      sVar3 = strlen(_optarg);
      if (7 < sVar3) {
        sStack_10608.sa_data._6_4_ = (uint)uVar7 | 0x80000000;
      }
      goto LAB_00101669;
    case 0x66:
      main::opts.flags = main::opts.flags | 0x80;
      uVar7 = strtoul(_optarg,(char **)0x0,10);
      uStack_10614 = (undefined4)uVar7;
      goto LAB_00101669;
    case 0x67:
      uStack_105f0 = strtoul(_optarg,(char **)0x0,10);
      goto LAB_00101669;
    case 0x6c:
      goto switchD_0010168a_caseD_6c;
    case 0x70:
      iVar1 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040d5,0x1040d6);
      if (iVar1 == 2) {
        main::opts.flags = main::opts.flags | 0xc;
        goto LAB_00101669;
      }
      if (iVar1 == 1) {
        main::opts.flags = main::opts.flags | 4;
        goto LAB_00101669;
      }
      iVar1 = __isoc99_sscanf(_optarg,":%hhx",0x1040d6);
      if (iVar1 == 1) {
        main::opts.flags = main::opts.flags | 8;
        goto LAB_00101669;
      }
      break;
    case 0x73:
      uVar7 = strtoul(_optarg,(char **)0x0,0x10);
      sStack_10608.sa_data._10_4_ = (uint)uVar7;
      sVar3 = strlen(_optarg);
      if (7 < sVar3) {
        sStack_10608.sa_data._10_4_ = (uint)uVar7 | 0x80000000;
      }
      goto LAB_00101669;
    case 0x74:
      iVar1 = strncmp(_optarg,"ZERO",4);
      if (iVar1 == 0) {
        main::opts.frame_txtime = 0xffffffff;
      }
      else {
        uVar7 = strtoul(__nptr,(char **)0x0,10);
        main::opts.frame_txtime = (__u32)uVar7;
      }
      goto LAB_00101669;
    default:
      if (iVar1 == 0x53) {
        main::opts.flags = main::opts.flags | 0x800;
      }
      else {
        if (iVar1 != 0x78) goto switchD_0010168a_caseD_63;
        iVar1 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040d4,0x1040d7);
        uVar6 = 2;
        if (iVar1 != 1) {
          if (iVar1 != 2) goto LAB_00101c16;
          uVar6 = 0x202;
        }
        main::opts.flags = main::opts.flags | uVar6;
      }
      goto LAB_00101669;
    }
    main_cold_6();
LAB_00101c26:
    main_cold_5();
LAB_00101c31:
    main_cold_13();
LAB_00101c39:
    main_cold_12();
LAB_00101c3e:
    main_cold_11();
LAB_00101c43:
    main_cold_10();
  }
  main_cold_9();
LAB_00101c4f:
  main_cold_8();
  return extraout_EAX;
switchD_0010168a_caseD_6c:
  uVar8 = 0;
  if ((*_optarg != 'i') && (uVar8 = strtoul(_optarg,(char **)0x0,10), (int)uVar8 == 0)) {
    main_cold_3();
    return 1;
  }
  goto LAB_00101669;
  while (uVar7 = uVar7 + 1, uVar7 != 67000) {
LAB_00101b23:
    iVar2 = __isoc99_scanf("%hhx",acStack_105e8 + uVar7);
    if (iVar2 != 1) goto LAB_00101b4f;
  }
  uVar7 = 67000;
LAB_00101b4f:
  while( true ) {
    if ((__useconds_t)uStack_105f0 != 0) {
      usleep((__useconds_t)uStack_105f0);
    }
    uVar4 = write(iVar1,acStack_105e8,uVar7 & 0xffffffff);
    iVar2 = (int)uVar4;
    if (iVar2 < 0) break;
    if ((int)uVar7 != iVar2) {
      fprintf(_stderr,"wrote only %d from %d byte\n",uVar4 & 0xffffffff,uVar7 & 0xffffffff);
    }
    iVar2 = (int)uVar8;
    uVar8 = 0;
    if ((iVar2 != 0) && (uVar6 = iVar2 - 1, uVar8 = (ulong)uVar6, uVar6 == 0)) {
      close(iVar1);
      return 0;
    }
  }
  perror("write");
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
    int s;
    struct sockaddr_can addr;
    static struct can_isotp_options opts;
    static struct can_isotp_ll_options llopts;
    int opt;
    extern int optind, opterr, optopt;
    unsigned int loops = 1; /* one (== no) loop by default */
    useconds_t usecs = 0; /* wait before sending the PDU */
    __u32 force_tx_stmin = 0;
    unsigned char buf[BUFSIZE];
    int buflen = 0;
    int datalen = 0;
    int retval = 0;

    addr.can_addr.tp.tx_id = addr.can_addr.tp.rx_id = NO_CAN_ID;

    while ((opt = getopt(argc, argv, "s:d:x:p:P:t:f:D:l:g:bSCL:?")) != -1) {
	    switch (opt) {
	    case 's':
		    addr.can_addr.tp.tx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.tx_id |= CAN_EFF_FLAG;
		    break;

	    case 'd':
		    addr.can_addr.tp.rx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.rx_id |= CAN_EFF_FLAG;
		    break;

	    case 'x':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.ext_address,
					  &opts.rx_ext_address);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_EXTEND_ADDR;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_EXTEND_ADDR | CAN_ISOTP_RX_EXT_ADDR);
		    else {
			    printf("incorrect extended addr values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'p':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.txpad_content,
					  &opts.rxpad_content);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_TX_PADDING;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_TX_PADDING | CAN_ISOTP_RX_PADDING);
		    else if (sscanf(optarg, ":%hhx", &opts.rxpad_content) == 1)
			    opts.flags |= CAN_ISOTP_RX_PADDING;
		    else {
			    printf("incorrect padding values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'P':
		    if (optarg[0] == 'l')
			    opts.flags |= CAN_ISOTP_CHK_PAD_LEN;
		    else if (optarg[0] == 'c')
			    opts.flags |= CAN_ISOTP_CHK_PAD_DATA;
		    else if (optarg[0] == 'a')
			    opts.flags |= (CAN_ISOTP_CHK_PAD_LEN | CAN_ISOTP_CHK_PAD_DATA);
		    else {
			    printf("unknown padding check option '%c'.\n", optarg[0]);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 't':
		    if (!strncmp(optarg, ZERO_STRING, strlen(ZERO_STRING)))
			    opts.frame_txtime = CAN_ISOTP_FRAME_TXTIME_ZERO;
		    else
			    opts.frame_txtime = strtoul(optarg, NULL, 10);
		    break;

	    case 'f':
		    opts.flags |= CAN_ISOTP_FORCE_TXSTMIN;
		    force_tx_stmin = strtoul(optarg, NULL, 10);
		    break;

	    case 'D':
		    datalen = strtoul(optarg, NULL, 10);
		    if (!datalen || datalen >= BUFSIZE) {
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 'l':
		    if (optarg[0] == 'i') {
			    loops = 0; /* infinite loop */
		    } else {
			    loops = strtoul(optarg, NULL, 10);
			    if (!loops) {
				    fprintf(stderr, "Invalid argument for option -l!\n");
				    return 1;
			    }
		    }
		    break;

	    case 'g':
		    usecs = strtoul(optarg, NULL, 10);
		    break;

	    case 'b':
		    opts.flags |= CAN_ISOTP_WAIT_TX_DONE;
		    break;

	    case 'S':
		    opts.flags |= CAN_ISOTP_SF_BROADCAST;
		    break;

	    case 'C':
		    opts.flags |= CAN_ISOTP_CF_BROADCAST;
		    break;

	    case 'L':
		    if (sscanf(optarg, "%hhu:%hhu:%hhu",
			       &llopts.mtu,
			       &llopts.tx_dl,
			       &llopts.tx_flags) != 3) {
			    printf("unknown link layer options '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case '?':
		    print_usage(basename(argv[0]));
		    exit(0);
		    break;

	    default:
		    fprintf(stderr, "Unknown option %c\n", opt);
		    print_usage(basename(argv[0]));
		    exit(1);
		    break;
	    }
    }

#define BC_FLAGS (CAN_ISOTP_SF_BROADCAST | CAN_ISOTP_CF_BROADCAST)

    if ((argc - optind != 1) ||
	(addr.can_addr.tp.tx_id == NO_CAN_ID) ||
	((opts.flags & BC_FLAGS) == BC_FLAGS) ||
	((addr.can_addr.tp.rx_id == NO_CAN_ID) &&
	 (!(opts.flags & BC_FLAGS)))) {
	    print_usage(basename(argv[0]));
	    exit(1);
    }

    if ((s = socket(PF_CAN, SOCK_DGRAM, CAN_ISOTP)) < 0) {
	perror("socket");
	exit(1);
    }

    if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_OPTS, &opts, sizeof(opts)) < 0) {
	perror("sockopt");
	exit(1);
    }


    if (llopts.tx_dl) {
	if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_LL_OPTS, &llopts, sizeof(llopts)) < 0) {
	    perror("link layer sockopt");
	    exit(1);
	}
    }

    if (opts.flags & CAN_ISOTP_FORCE_TXSTMIN)
	    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_TX_STMIN, &force_tx_stmin, sizeof(force_tx_stmin));

    addr.can_family = AF_CAN;
    addr.can_ifindex = if_nametoindex(argv[optind]);
    if (!addr.can_ifindex) {
	perror("if_nametoindex");
	exit(1);
    }

    if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
	perror("bind");
	close(s);
	exit(1);
    }

    if (!datalen) {
	    while (buflen < BUFSIZE && scanf("%hhx", &buf[buflen]) == 1)
		    buflen++;
    } else {
	    for (buflen = 0; buflen < datalen; buflen++)
		    buf[buflen] = ((buflen % 0xFF) + 1) & 0xFF;
    }

loop:
    if (usecs)
	    usleep(usecs);

    retval = write(s, buf, buflen);
    if (retval < 0) {
	    perror("write");
	    return retval;
    }

    if (retval != buflen)
	    fprintf(stderr, "wrote only %d from %d byte\n", retval, buflen);

    if (loops) {
	    if (--loops)
		    goto loop;
    } else {
	    goto loop;
    }

    /* 
     * due to a Kernel internal wait queue the PDU is sent completely
     * before close() returns.
     */
    close(s);

    return 0;
}